

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

void Test<float,_float,_double>::calculateErrorStatistics(Errors *errors)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double dVar6;
  storage_t sVar7;
  undefined1 auVar8 [16];
  pair<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar9;
  
  pVar9 = std::
          __minmax_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((errors->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (errors->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  sVar7 = *pVar9.second._M_current._M_current;
  errors->minimum = *pVar9.first._M_current._M_current;
  errors->maximum = sVar7;
  pdVar2 = (errors->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar6 = 0.0;
  pdVar1 = (errors->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar5 = pdVar1; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
    dVar6 = dVar6 + *pdVar5;
  }
  lVar3 = (long)pdVar2 - (long)pdVar1;
  lVar4 = lVar3 >> 3;
  auVar8._8_4_ = (int)(lVar3 >> 0x23);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  errors->mean = dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  sVar7 = median(&errors->values);
  errors->median = sVar7;
  sVar7 = variance(&errors->values);
  errors->variance = sVar7;
  return;
}

Assistant:

static void calculateErrorStatistics(typename Result<input_t, storage_t>::Errors& errors)
    {
        auto minmaxValue = minmax(errors.values);
        errors.minimum = minmaxValue.first;
        errors.maximum = minmaxValue.second;
        errors.mean = mean(errors.values);
        errors.median = median(errors.values);
        errors.variance = variance(errors.values);
    }